

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

int adiak_get_subval(adiak_datatype_t *t,adiak_value_t *val,int elem,adiak_datatype_t **subtype,
                    adiak_value_t *subval)

{
  int iVar1;
  adiak_value_t *paVar2;
  adiak_datatype_t *local_58;
  uchar *ptr;
  int local_40;
  int s;
  int n;
  int bytes;
  adiak_value_t *subval_local;
  adiak_datatype_t **subtype_local;
  int elem_local;
  adiak_value_t *val_local;
  adiak_datatype_t *t_local;
  
  if (-1 < elem) {
    if (t->is_reference == 0) {
      if (elem < t->num_elements) {
        if (t->dtype == adiak_tuple) {
          local_58 = t->subtype[elem];
        }
        else {
          local_58 = *t->subtype;
        }
        *subtype = local_58;
        *subval = *(adiak_value_t *)((long)val->v_ptr + (long)elem * 8);
        return 0;
      }
    }
    else if (elem < t->num_ref_elements) {
      s = 0;
      if (t->dtype == adiak_tuple) {
        for (local_40 = 0; local_40 < elem; local_40 = local_40 + 1) {
          iVar1 = calc_size(t->subtype[local_40]);
          if (iVar1 < 0) goto LAB_00126872;
          s = iVar1 + s;
        }
        *subtype = t->subtype[elem];
      }
      else {
        iVar1 = calc_size(*t->subtype);
        s = elem * iVar1;
        if (s < 0) goto LAB_00126872;
        *subtype = *t->subtype;
      }
      paVar2 = (adiak_value_t *)((long)val->v_ptr + (long)s);
      switch((*subtype)->dtype) {
      case adiak_type_unset:
        subval->v_long = 0;
        return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
        *subval = *paVar2;
        break;
      case adiak_int:
      case adiak_uint:
        subval->v_int = paVar2->v_int;
        break;
      case adiak_double:
        *subval = *paVar2;
        break;
      case adiak_timeval:
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
        *subval = *paVar2;
        break;
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
        subval->v_subval = paVar2;
        break;
      case adiak_longlong:
      case adiak_ulonglong:
        *subval = *paVar2;
      }
      return 0;
    }
  }
LAB_00126872:
  *subtype = (adiak_datatype_t *)0x0;
  subval->v_long = 0;
  return -1;
}

Assistant:

int adiak_get_subval(adiak_datatype_t* t, adiak_value_t* val, int elem, adiak_datatype_t** subtype, adiak_value_t* subval)
{
   /* Return if this is not a container type or we're out-of-bounds. */
   if (elem < 0)
      goto error;

   /* Adiak-owned data:
    * Data is in val->v_subval. Simply return the selected subvalue.
    */
   if (!t->is_reference) {
      if (elem >= t->num_elements)
         goto error;
      *subtype = (t->dtype == adiak_tuple ? t->subtype[elem] : t->subtype[0]);
      *subval = val->v_subval[elem];
      return 0;
   }

   /* Zero-copy data:
    * Data is in val->v_ptr. Make a adiak_value_t for the selected subvalue.
    */

   if (elem >= t->num_ref_elements)
      goto error;

   /* Compute offset of the selected subvalue. */
   int bytes = 0;
   if (t->dtype == adiak_tuple) {
      for (int n = 0; n < elem; ++n) {
         int s = calc_size(t->subtype[n]);
         if (s < 0)
            goto error;
         bytes += s;
      }
      *subtype = t->subtype[elem];
   } else {
      bytes = elem * calc_size(t->subtype[0]);
      if (bytes < 0)
         goto error;
      *subtype = t->subtype[0];
   }

   unsigned char* ptr = ((unsigned char*) val->v_ptr) + bytes;

   switch ((*subtype)->dtype) {
      case adiak_type_unset:
         (*subval).v_ptr = NULL;
         return -1;
      case adiak_long:
      case adiak_ulong:
      case adiak_date:
         (*subval).v_long = *((long *) ptr);
         break;
      case adiak_longlong:
      case adiak_ulonglong:
         (*subval).v_longlong = *((long long *) ptr);
         break;
      case adiak_int:
      case adiak_uint:
         (*subval).v_int = *((int *) ptr);
         break;
      case adiak_double:
         (*subval).v_double = *((double *) ptr);
         break;
      case adiak_timeval:
      case adiak_version:
      case adiak_string:
      case adiak_catstring:
      case adiak_path:
         (*subval).v_ptr = *((void**) ptr);
         break;
      case adiak_range:
      case adiak_set:
      case adiak_list:
      case adiak_tuple:
         (*subval).v_ptr = (void*) ptr;
         break;
   }

   return 0;

error:
   *subtype = NULL;
   (*subval).v_ptr = NULL;
   return -1;
}